

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O0

void Abc_NtkCollectOverlapCands(Abc_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_00;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Nwk_LMPars_t *pPars_local;
  Vec_Ptr_t *vCands_local;
  Abc_Obj_t *pLut_local;
  
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pLut), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Abc_ObjFanin(pLut,local_34);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffbf | 0x40;
  }
  Vec_PtrClear(vCands);
  Abc_NtkIncrementTravId(pLut->pNtk);
  Abc_NodeSetTravIdCurrent(pLut);
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pLut), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Abc_ObjFanin(pLut,local_34);
    iVar1 = Abc_ObjIsNode(pAVar3);
    if ((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(pAVar3), iVar1 <= pPars->nMaxFanout)) {
      for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_38 < iVar1; local_38 = local_38 + 1
          ) {
        pObj_00 = Abc_ObjFanout(pAVar3,local_38);
        iVar1 = Abc_ObjIsNode(pObj_00);
        if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj_00), iVar1 == 0)) {
          Abc_NodeSetTravIdCurrent(pObj_00);
          iVar1 = Abc_ObjLevel(pLut);
          iVar2 = Abc_ObjLevel(pObj_00);
          if (iVar1 - iVar2 <= pPars->nMaxLevelDiff) {
            iVar1 = Abc_ObjLevel(pObj_00);
            iVar2 = Abc_ObjLevel(pLut);
            if ((iVar1 - iVar2 <= pPars->nMaxLevelDiff) &&
               (iVar1 = Abc_NtkCountTotalFanins(pLut,pObj_00), iVar1 <= pPars->nMaxSuppSize)) {
              Vec_PtrPush(vCands,pObj_00);
            }
          }
        }
      }
    }
  }
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pLut), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Abc_ObjFanin(pLut,local_34);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffbf;
  }
  return;
}

Assistant:

void Abc_NtkCollectOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Abc_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    Abc_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Abc_ObjIsNode(pFanin) )
            continue;
        if ( Abc_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Abc_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Abc_ObjIsNode(pObj) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pObj ) )
                continue;
            Abc_NodeSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Abc_NtkCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 0;
}